

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

bool vkt::SpirVAssembly::passthruVerify
               (vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                *param_1,
               vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               *outputAllocs,
               vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
               *expectedOutputs,TestLog *param_4)

{
  int iVar1;
  size_type sVar2;
  const_reference this;
  BufferInterface *pBVar3;
  undefined4 extraout_var;
  reference __dest;
  const_reference this_00;
  Allocation *this_01;
  void *__src;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> data;
  size_t width;
  size_t outputNdx;
  TestLog *param_3_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *expectedOutputs_local;
  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
  *outputAllocs_local;
  vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
  *param_0_local;
  
  width = 0;
  while( true ) {
    sVar2 = std::
            vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>::
            size(outputAllocs);
    if (sVar2 <= width) break;
    this = std::
           vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
           ::operator[](expectedOutputs,width);
    pBVar3 = de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::operator->(this);
    iVar1 = (*pBVar3->_vptr_BufferInterface[2])();
    data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         CONCAT44(extraout_var,iVar1);
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_50,CONCAT44(extraout_var,iVar1),
               &local_51);
    std::allocator<char>::~allocator(&local_51);
    __dest = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_50,0);
    this_00 = std::
              vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ::operator[](outputAllocs,width);
    this_01 = de::SharedPtr<vk::Allocation>::operator->(this_00);
    __src = ::vk::Allocation::getHostPtr(this_01);
    memcpy(__dest,__src,data.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_50);
    width = width + 1;
  }
  return true;
}

Assistant:

bool passthruVerify (const std::vector<BufferSp>&, const vector<AllocationSp>& outputAllocs, const std::vector<BufferSp>& expectedOutputs, TestLog&)
{
	DE_ASSERT(outputAllocs.size() != 0);
	DE_ASSERT(outputAllocs.size() == expectedOutputs.size());

	// Copy and discard the result.
	for (size_t outputNdx = 0; outputNdx < outputAllocs.size(); ++outputNdx)
	{
		size_t width = expectedOutputs[outputNdx]->getNumBytes();

		vector<char> data(width);
		memcpy(&data[0], outputAllocs[outputNdx]->getHostPtr(), width);
	}
	return true;
}